

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpumon.cpp
# Opt level: O3

void __thiscall cpumon::get_hardware_info(cpumon *this,json *hw_json)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  int iVar3;
  json_value jVar4;
  uint __val;
  key_type *pkVar5;
  uint uVar6;
  const_iterator cVar7;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar8;
  reference pvVar9;
  int *piVar10;
  long *plVar11;
  undefined8 uVar12;
  uint uVar13;
  _Alloc_hider _Var14;
  long *plVar15;
  ulong *puVar16;
  ulong uVar17;
  long lVar18;
  pointer pbVar19;
  _Alloc_hider _Var20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  pointer pbVar22;
  uint __len;
  data *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __result;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  metricToName;
  pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  cmd_result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  data local_2a8;
  data local_290;
  byte *local_280;
  undefined8 local_278;
  byte local_270 [16];
  pointer local_260;
  key_type local_258;
  key_type local_238;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_218;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1e0;
  pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  paVar1 = &local_170.first.field_2;
  local_170.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"lscpu","");
  __l._M_len = 1;
  __l._M_array = &local_170.first;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_188,__l,(allocator_type *)&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_170.first._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1a0,&local_188);
  prmon::cmd_pipe_output(&local_1c0,&local_1a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a0);
  if (local_1c0.first == 0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[11],_const_char_(&)[10],_true>
              (&local_170,(char (*) [11])"Model name",(char (*) [10])"ModelName");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[7],_const_char_(&)[5],_true>
              (&local_130,(char (*) [7])"CPU(s)",(char (*) [5])"CPUs");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
              (&local_f0,(char (*) [10])"Socket(s)",(char (*) [8])"Sockets");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[19],_const_char_(&)[15],_true>
              (&local_b0,(char (*) [19])"Core(s) per socket",(char (*) [15])"CoresPerSocket");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[19],_const_char_(&)[15],_true>
              (&local_70,(char (*) [19])"Thread(s) per core",(char (*) [15])"ThreadsPerCore");
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_218,&local_170,&stack0xffffffffffffffd0,0,&local_2c8,&local_280,&local_1e0)
    ;
    lVar18 = -0x140;
    paVar21 = &local_70.second.field_2;
    do {
      if (paVar21 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)(paVar21->_M_local_buf + -0x10)) {
        operator_delete(*(undefined1 **)(paVar21->_M_local_buf + -0x10));
      }
      if (paVar21->_M_local_buf + -0x20 != *(char **)(paVar21->_M_local_buf + -0x30)) {
        operator_delete(*(char **)(paVar21->_M_local_buf + -0x30));
      }
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar21->_M_local_buf + -0x40);
      lVar18 = lVar18 + 0x40;
    } while (lVar18 != 0);
    local_170.first._M_string_length = 0;
    local_170.first.field_2._M_allocated_capacity =
         local_170.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    local_2c8._M_string_length = 0;
    local_2c8.field_2._M_local_buf[0] = '\0';
    local_170.first._M_dataplus._M_p = (pointer)paVar1;
    if (local_1c0.second.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1c0.second.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_260 = local_1c0.second.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pbVar19 = local_1c0.second.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar22 = local_1c0.second.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if ((pbVar22->_M_string_length != 0) &&
           (lVar18 = std::__cxx11::string::find((char *)pbVar22,0x193f86,0), lVar18 != -1)) {
          std::__cxx11::string::substr((ulong)&local_280,(ulong)pbVar22);
          std::__cxx11::string::operator=((string *)&local_170,(string *)&local_280);
          if (local_280 != local_270) {
            operator_delete(local_280);
          }
          std::__cxx11::string::substr((ulong)&local_280,(ulong)pbVar22);
          std::__cxx11::string::operator=((string *)&local_2c8,(string *)&local_280);
          if (local_280 != local_270) {
            operator_delete(local_280);
          }
          if ((local_170.first._M_string_length != 0) && (local_2c8._M_string_length != 0)) {
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                      (&local_1e0,"^\\s+|\\s+$",0x10);
            local_278 = 0;
            local_270[0] = 0;
            local_280 = local_270;
            std::
            __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_280,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_170.first._M_dataplus._M_p,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_170.first._M_dataplus._M_p + local_170.first._M_string_length),
                       &local_1e0,"",0,0);
            std::__cxx11::string::operator=((string *)&local_170,(string *)&local_280);
            if (local_280 != local_270) {
              operator_delete(local_280);
            }
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                      (&local_1e0);
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                      (&local_1e0,"^\\s+|\\s+$",0x10);
            local_278 = 0;
            local_270[0] = 0;
            local_280 = local_270;
            std::
            __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_280,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_2c8._M_dataplus._M_p,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_2c8._M_dataplus._M_p + local_2c8._M_string_length),&local_1e0,"",0,0
                      );
            std::__cxx11::string::operator=((string *)&local_2c8,(string *)&local_280);
            if (local_280 != local_270) {
              operator_delete(local_280);
            }
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                      (&local_1e0);
            cVar7 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&local_218,&local_170.first);
            _Var20._M_p = local_2c8._M_dataplus._M_p;
            if (cVar7.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              if (local_2c8._M_string_length == 0) {
LAB_0017c64d:
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_290,&local_2c8);
                pbVar8 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>
                                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                        *)hw_json,"HW");
                pvVar9 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         ::operator[]<char_const>(pbVar8,"cpu");
                cVar7 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(&local_218,&local_170.first);
                if (cVar7.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  std::__throw_out_of_range("_Map_base::at");
LAB_0017ca13:
                  std::__throw_out_of_range("_Map_base::at");
LAB_0017ca1f:
                  std::__throw_out_of_range("stoi");
LAB_0017ca2b:
                  uVar12 = std::__throw_invalid_argument("stoi");
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::data::~data(&local_2a8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                    operator_delete(local_2c8._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_170.first._M_dataplus._M_p != &local_170.first.field_2) {
                    operator_delete(local_170.first._M_dataplus._M_p);
                  }
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::~_Hashtable(&local_218);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_1c0.second);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_188);
                  _Unwind_Resume(uVar12);
                }
                local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_258,
                           *(long *)((long)cVar7.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                           ._M_cur + 0x28),
                           *(long *)((long)cVar7.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                           ._M_cur + 0x30) +
                           *(long *)((long)cVar7.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                           ._M_cur + 0x28));
                pvVar9 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         ::operator[](pvVar9,&local_258);
                vVar2 = (pvVar9->m_data).m_type;
                (pvVar9->m_data).m_type = local_290.m_type;
                jVar4 = (pvVar9->m_data).m_value;
                (pvVar9->m_data).m_value = local_290.m_value;
                this_00 = &local_290;
                pkVar5 = &local_258;
                _Var20._M_p = local_258._M_dataplus._M_p;
                local_290.m_type = vVar2;
                local_290.m_value = jVar4;
              }
              else {
                paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
                _Var14._M_p = local_2c8._M_dataplus._M_p;
                if (0 < (long)local_2c8._M_string_length >> 2) {
                  _Var14._M_p = local_2c8._M_dataplus._M_p +
                                (local_2c8._M_string_length & 0xfffffffffffffffc);
                  lVar18 = ((long)local_2c8._M_string_length >> 2) + 1;
                  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_2c8._M_dataplus._M_p + 3);
                  do {
                    if ((byte)paVar21->_M_local_buf[-3] - 0x3a < 0xfffffff6) {
                      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(paVar21->_M_local_buf + -3);
                      goto LAB_0017c644;
                    }
                    if ((byte)paVar21->_M_local_buf[-2] - 0x3a < 0xfffffff6) {
                      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(paVar21->_M_local_buf + -2);
                      goto LAB_0017c644;
                    }
                    if ((byte)paVar21->_M_local_buf[-1] - 0x3a < 0xfffffff6) {
                      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(paVar21->_M_local_buf + -1);
                      goto LAB_0017c644;
                    }
                    if ((byte)paVar21->_M_local_buf[0] - 0x3a < 0xfffffff6) goto LAB_0017c644;
                    lVar18 = lVar18 + -1;
                    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(paVar21->_M_local_buf + 4);
                  } while (1 < lVar18);
                }
                lVar18 = (long)paVar1 - (long)_Var14._M_p;
                if (lVar18 == 1) {
LAB_0017c623:
                  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)_Var14._M_p;
                  if (0xfffffff5 < (byte)*_Var14._M_p - 0x3a) {
                    paVar21 = paVar1;
                  }
LAB_0017c644:
                  if (paVar21 != paVar1) goto LAB_0017c64d;
                }
                else {
                  if (lVar18 == 2) {
LAB_0017c615:
                    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)_Var14._M_p;
                    if (0xfffffff5 < (byte)*_Var14._M_p - 0x3a) {
                      _Var14._M_p = _Var14._M_p + 1;
                      goto LAB_0017c623;
                    }
                    goto LAB_0017c644;
                  }
                  if (lVar18 == 3) {
                    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)_Var14._M_p;
                    if (0xfffffff5 < (byte)*_Var14._M_p - 0x3a) {
                      _Var14._M_p = _Var14._M_p + 1;
                      goto LAB_0017c615;
                    }
                    goto LAB_0017c644;
                  }
                }
                piVar10 = __errno_location();
                iVar3 = *piVar10;
                *piVar10 = 0;
                lVar18 = strtol(_Var20._M_p,(char **)&local_280,10);
                if (local_280 == (byte *)_Var20._M_p) goto LAB_0017ca2b;
                if (((int)lVar18 != lVar18) || (*piVar10 == 0x22)) goto LAB_0017ca1f;
                if (*piVar10 == 0) {
                  *piVar10 = iVar3;
                }
                local_2a8.m_type = null;
                local_2a8._1_7_ = 0;
                local_2a8.m_value.object = (object_t *)0x0;
                nlohmann::json_abi_v3_11_3::detail::
                external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
                construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_2a8,lVar18);
                pbVar8 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>
                                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                        *)hw_json,"HW");
                pbVar19 = local_260;
                pvVar9 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         ::operator[]<char_const>(pbVar8,"cpu");
                cVar7 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(&local_218,&local_170.first);
                if (cVar7.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur == (__node_type *)0x0) goto LAB_0017ca13;
                local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_238,
                           *(long *)((long)cVar7.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                           ._M_cur + 0x28),
                           *(long *)((long)cVar7.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                           ._M_cur + 0x30) +
                           *(long *)((long)cVar7.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                           ._M_cur + 0x28));
                pvVar9 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         ::operator[](pvVar9,&local_238);
                vVar2 = (pvVar9->m_data).m_type;
                (pvVar9->m_data).m_type = local_2a8.m_type;
                local_2a8.m_type = vVar2;
                jVar4 = (pvVar9->m_data).m_value;
                (pvVar9->m_data).m_value = local_2a8.m_value;
                this_00 = &local_2a8;
                pkVar5 = &local_238;
                _Var20._M_p = local_238._M_dataplus._M_p;
                local_2a8.m_value = jVar4;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var20._M_p != &pkVar5->field_2) {
                operator_delete(_Var20._M_p);
              }
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(this_00);
            }
          }
        }
        pbVar22 = pbVar22 + 1;
      } while (pbVar22 != pbVar19);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.first._M_dataplus._M_p != &local_170.first.field_2) {
      operator_delete(local_170.first._M_dataplus._M_p);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_218);
  }
  else {
    __val = -local_1c0.first;
    if (0 < local_1c0.first) {
      __val = local_1c0.first;
    }
    __len = 1;
    if (9 < __val) {
      uVar17 = (ulong)__val;
      uVar6 = 4;
      do {
        __len = uVar6;
        uVar13 = (uint)uVar17;
        if (uVar13 < 100) {
          __len = __len - 2;
          goto LAB_0017c890;
        }
        if (uVar13 < 1000) {
          __len = __len - 1;
          goto LAB_0017c890;
        }
        if (uVar13 < 10000) goto LAB_0017c890;
        uVar17 = uVar17 / 10000;
        uVar6 = __len + 4;
      } while (99999 < uVar13);
      __len = __len + 1;
    }
LAB_0017c890:
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_2c8,(char)__len - (char)(local_1c0.first >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_2c8._M_dataplus._M_p + ((uint)local_1c0.first >> 0x1f),__len,__val);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,0x197acd);
    plVar15 = plVar11 + 2;
    if ((__node_base *)*plVar11 == (__node_base *)plVar15) {
      local_218._M_before_begin._M_nxt = (_Hash_node_base *)*plVar15;
      local_218._M_element_count = plVar11[3];
      local_218._M_buckets = &local_218._M_before_begin._M_nxt;
    }
    else {
      local_218._M_before_begin._M_nxt = (_Hash_node_base *)*plVar15;
      local_218._M_buckets = (__buckets_ptr)*plVar11;
    }
    local_218._M_bucket_count = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
    puVar16 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_170.first.field_2._M_allocated_capacity = *puVar16;
      local_170.first.field_2._8_8_ = plVar11[3];
      local_170.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_170.first.field_2._M_allocated_capacity = *puVar16;
      local_170.first._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_170.first._M_string_length = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    MessageBase::error(&this->super_MessageBase,&local_170.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_170.first._M_dataplus._M_p);
    }
    if ((__node_base *)local_218._M_buckets != &local_218._M_before_begin) {
      operator_delete(local_218._M_buckets);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0.second);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  return;
}

Assistant:

void const cpumon::get_hardware_info(nlohmann::json& hw_json) {
  // Define the command and run it
  const std::vector<std::string> cmd = {"lscpu"};

  auto cmd_result = prmon::cmd_pipe_output(cmd);

  // If the command failed print an error and move on
  if (cmd_result.first) {
    error("Failed to execute 'lscpu' to get CPU information (code " +
          std::to_string(cmd_result.first) + ")");
    return;
  }

  // Map lscpu names to the desired ones in the JSON
  const std::unordered_map<std::string, std::string> metricToName{
      {"Model name", "ModelName"},
      {"CPU(s)", "CPUs"},
      {"Socket(s)", "Sockets"},
      {"Core(s) per socket", "CoresPerSocket"},
      {"Thread(s) per core", "ThreadsPerCore"}};

  // Useful function to determine if a string is purely a number
  auto isNumber = [](const std::string& s) {
    return !s.empty() && std::find_if(s.begin(), s.end(), [](unsigned char c) {
                           return !std::isdigit(c);
                         }) == s.end();
  };

  // Loop over the output, parse the line, check the key and store the value if
  // requested
  std::string key{}, value{};

  for (const auto& line : cmd_result.second) {
    // Continue on empty line
    if (line.empty()) continue;

    // Tokenize by ":"
    size_t splitIdx = line.find(":");
    if (splitIdx == std::string::npos) continue;

    // Read "key":"value" pairs
    key = line.substr(0, splitIdx);
    value = line.substr(splitIdx + 1);
    if (key.empty() || value.empty()) continue;
    key = std::regex_replace(key, std::regex("^\\s+|\\s+$"), "");
    value = std::regex_replace(value, std::regex("^\\s+|\\s+$"), "");

    // Fill the JSON with the information
    if (metricToName.count(key) == 1) {
      if (isNumber(value))
        hw_json["HW"]["cpu"][metricToName.at(key)] = std::stoi(value);
      else
        hw_json["HW"]["cpu"][metricToName.at(key)] = value;
    }
  }

  return;
}